

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_code.cpp
# Opt level: O2

void Init(void)

{
  DebugStream local_4a;
  allocator local_49;
  string local_48;
  string local_28 [32];
  
  std::__cxx11::string::string(local_28,"r_code",&local_49);
  std::__cxx11::string::string((string *)&local_48,local_28);
  DebugStream::DebugStream(&local_4a,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  DebugStream::operator<<(&local_4a,"r_code library loaded");
  DebugStream::~DebugStream(&local_4a);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void Init()
{
    debug("r_code") << "r_code library loaded";
}